

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb_free(void *p)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 *__ptr;
  long *__ptr_00;
  
  if (p != (void *)0x0) {
    stb_alloc_count_free = stb_alloc_count_free + 1;
    switch((uint)*(long **)((long)p + -8) & 3) {
    case 0:
      __ptr = (undefined8 *)((long)p + -0x10);
      lVar1 = *(long *)((long)p + -0x10);
      **(long **)((long)p + -8) = lVar1;
      if (lVar1 != 0) {
        puVar3 = (undefined8 *)(lVar1 + -0x20);
        if ((*(uint *)(lVar1 + -8) & 3) != 2) {
          puVar3 = (undefined8 *)(lVar1 + -8);
        }
        *puVar3 = *(undefined8 *)((long)p + -8);
      }
      break;
    case 1:
      goto switchD_0014e7cf_caseD_1;
    case 2:
      __ptr = (undefined8 *)((long)p + -0x20);
      lVar1 = *(long *)((long)p + -0x10);
      **(long **)((long)p + -0x20) = lVar1;
      if (lVar1 != 0) {
        puVar3 = (undefined8 *)(lVar1 + -0x20);
        if ((*(uint *)(lVar1 + -8) & 3) != 2) {
          puVar3 = (undefined8 *)(lVar1 + -8);
        }
        *puVar3 = *__ptr;
      }
      __ptr_00 = (long *)(*(long *)((long)p + -8) + -2);
      do {
        plVar2 = (long *)*__ptr_00;
        stb_alloc_count_free = stb_alloc_count_free + *(int *)((long)__ptr_00 + 0xc);
        free(__ptr_00);
        __ptr_00 = plVar2;
      } while (plVar2 != (long *)0x0);
      *(undefined8 *)((long)p + -8) = 2;
      *(undefined8 *)((long)p + -0x20) = 0;
      *(undefined8 *)((long)p + -0x10) = 0;
      while (*(void **)((long)p + -0x18) != (void *)0x0) {
        stb_free(*(void **)((long)p + -0x18));
      }
      break;
    case 3:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0xa23,"void stb_free(void *)");
    }
    free(__ptr);
    return;
  }
switchD_0014e7cf_caseD_1:
  return;
}

Assistant:

void stb_free(void *p)
{
   if (p == NULL) return;

   // count frees so that unit tests can see what's happening
   ++stb_alloc_count_free;

   switch(stb__identify(p)) {
      case STB__chunked:
         // freeing a chunked-block with children does nothing;
         // they only get freed when the parent does
         // surely this is wrong, and it should free them immediately?
         // otherwise how are they getting put on the right chain?
         return;
      case STB__nochildren: {
         stb__nochildren *s = (stb__nochildren *) p - 1;
         // unlink from sibling chain
         *(s->prevn) = s->next;
         if (s->next)
            *stb__prevn(s->next) = s->prevn;
         free(s);
         return;
      }
      case STB__alloc: {
         stb__alloc *s = (stb__alloc *) p - 1;
         stb__chunk *c, *n;
         void *q;

         // unlink from sibling chain, if any
         *(s->prevn) = s->next;
         if (s->next)
            *stb__prevn(s->next) = s->prevn;

         // first free chunks
         c = (stb__chunk *) stb__chunks(s);
         while (c != NULL) {
            n = c->next;
            stb_alloc_count_free += c->alloc;
            free(c);
            c = n;
         }

         // validating
         stb__setchunks(s,NULL);
         s->prevn = NULL;
         s->next = NULL;

         // now free children
         while ((q = s->child) != NULL) {
            stb_free(q);
         }

         // now free self
         free(s);
         return;
      }
      default:
         assert(0); /* NOTREACHED */
   }
}